

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_engine_openmode(adios2_mode *mode,adios2_engine *engine)

{
  int iVar1;
  invalid_argument *this;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&local_58,"for const adios2_engine, in call to adios2_engine_openmode",
             (allocator *)&local_98);
  adios2::helper::CheckForNullptr<adios2_engine_const>(engine,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  iVar1 = adios2::core::Engine::OpenMode();
  std::__cxx11::string::string((string *)&local_78,"in adios2_engine_openmode()",&local_99);
  if (iVar1 - 1U < 6) {
    *mode = *(adios2_mode *)(&DAT_00128f98 + (ulong)(iVar1 - 1U) * 4);
    std::__cxx11::string::~string((string *)&local_78);
    return adios2_error_none;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"ERROR: invalid adios2::Mode, ",&local_78);
  std::operator+(&local_98,&local_38,"\n");
  std::invalid_argument::invalid_argument(this,(string *)&local_98);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2_error adios2_engine_openmode(adios2_mode *mode, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(
            engine, "for const adios2_engine, in call to adios2_engine_openmode");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        auto m = engineCpp->OpenMode();
        *mode = adios2_fromMode(m, "in adios2_engine_openmode()");
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_engine_openmode"));
    }
}